

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parser.c
# Opt level: O0

greatest_test_res parsing_single_instance(void)

{
  double dVar1;
  int32_t n;
  greatest_test_res greatest_RES;
  Instance instance;
  char *filepath;
  
  instance.edge_weight = (double *)anon_var_dwarf_587;
  parse((Instance *)&n,"data/ESPPRC - Test Instances/vrps/E-n101-k14_a.vrp");
  filepath._4_4_ = validate_instance((Instance *)&n,100,0xe);
  if (filepath._4_4_ == GREATEST_TEST_RES_PASS) {
    if ((*(double *)instance._32_8_ != 35.0) || (NAN(*(double *)instance._32_8_))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x46;
      greatest_info.msg = "instance.positions[0].x == 35";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 1;
    }
    else if ((*(double *)(instance._32_8_ + 8) != 35.0) || (NAN(*(double *)(instance._32_8_ + 8))))
    {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x47;
      greatest_info.msg = "instance.positions[0].y == 35";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 2;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 2;
    }
    else if (((instance.positions)->x != 0.0) || (NAN((instance.positions)->x))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x48;
      greatest_info.msg = "instance.demands[0] == 0";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 3;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 3;
    }
    else if ((*instance.demands != 7.247) || (NAN(*instance.demands))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x49;
      greatest_info.msg = "instance.profits[0] == 7.247";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 4;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 4;
    }
    else if ((*(double *)(instance._32_8_ + 0x10) != 41.0) ||
            (NAN(*(double *)(instance._32_8_ + 0x10)))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x4b;
      greatest_info.msg = "instance.positions[1].x == 41";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 5;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 5;
    }
    else if ((*(double *)(instance._32_8_ + 0x18) != 49.0) ||
            (NAN(*(double *)(instance._32_8_ + 0x18)))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x4c;
      greatest_info.msg = "instance.positions[1].y == 49";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 6;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 6;
    }
    else if (((instance.positions)->y != 10.0) || (NAN((instance.positions)->y))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x4d;
      greatest_info.msg = "instance.demands[1] == 10.0";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 7;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 7;
    }
    else if ((instance.demands[1] != 5.843) || (NAN(instance.demands[1]))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
      ;
      greatest_info.fail_line = 0x4e;
      greatest_info.msg = "instance.profits[1] == 5.843";
      if ((greatest_info.flags & 4) != 0) {
        greatest_info.assertions = greatest_info.assertions + 8;
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
      greatest_info.assertions = greatest_info.assertions + 8;
    }
    else {
      dVar1 = *(double *)(instance._32_8_ + (long)((int)instance.comment + -1) * 0x10);
      if ((dVar1 != 20.0) || (NAN(dVar1))) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
        ;
        greatest_info.fail_line = 0x52;
        greatest_info.msg = "instance.positions[n - 2].x == 20";
        if ((greatest_info.flags & 4) != 0) {
          greatest_info.assertions = greatest_info.assertions + 9;
          abort();
        }
        filepath._4_4_ = GREATEST_TEST_RES_FAIL;
        greatest_info.assertions = greatest_info.assertions + 9;
      }
      else {
        dVar1 = *(double *)(instance._32_8_ + (long)((int)instance.comment + -1) * 0x10 + 8);
        if ((dVar1 != 26.0) || (NAN(dVar1))) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
          ;
          greatest_info.fail_line = 0x53;
          greatest_info.msg = "instance.positions[n - 2].y == 26";
          if ((greatest_info.flags & 4) != 0) {
            greatest_info.assertions = greatest_info.assertions + 10;
            abort();
          }
          filepath._4_4_ = GREATEST_TEST_RES_FAIL;
          greatest_info.assertions = greatest_info.assertions + 10;
        }
        else if (((&(instance.positions)->x)[(int)instance.comment + -1] != 9.0) ||
                (NAN((&(instance.positions)->x)[(int)instance.comment + -1]))) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
          ;
          greatest_info.fail_line = 0x54;
          greatest_info.msg = "instance.demands[n - 2] == 9.0";
          if ((greatest_info.flags & 4) != 0) {
            greatest_info.assertions = greatest_info.assertions + 0xb;
            abort();
          }
          filepath._4_4_ = GREATEST_TEST_RES_FAIL;
          greatest_info.assertions = greatest_info.assertions + 0xb;
        }
        else if ((instance.demands[(int)instance.comment + -1] != 3.546) ||
                (NAN(instance.demands[(int)instance.comment + -1]))) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
          ;
          greatest_info.fail_line = 0x55;
          greatest_info.msg = "instance.profits[n - 2] == 3.546";
          if ((greatest_info.flags & 4) != 0) {
            greatest_info.assertions = greatest_info.assertions + 0xc;
            abort();
          }
          filepath._4_4_ = GREATEST_TEST_RES_FAIL;
          greatest_info.assertions = greatest_info.assertions + 0xc;
        }
        else {
          dVar1 = *(double *)(instance._32_8_ + (long)(int)instance.comment * 0x10);
          if ((dVar1 != 18.0) || (NAN(dVar1))) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
            ;
            greatest_info.fail_line = 0x57;
            greatest_info.msg = "instance.positions[n - 1].x == 18";
            if ((greatest_info.flags & 4) != 0) {
              greatest_info.assertions = greatest_info.assertions + 0xd;
              abort();
            }
            filepath._4_4_ = GREATEST_TEST_RES_FAIL;
            greatest_info.assertions = greatest_info.assertions + 0xd;
          }
          else {
            dVar1 = *(double *)(instance._32_8_ + (long)(int)instance.comment * 0x10 + 8);
            if ((dVar1 != 18.0) || (NAN(dVar1))) {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
              ;
              greatest_info.fail_line = 0x58;
              greatest_info.msg = "instance.positions[n - 1].y == 18";
              if ((greatest_info.flags & 4) != 0) {
                greatest_info.assertions = greatest_info.assertions + 0xe;
                abort();
              }
              filepath._4_4_ = GREATEST_TEST_RES_FAIL;
              greatest_info.assertions = greatest_info.assertions + 0xe;
            }
            else if (((&(instance.positions)->x)[(int)instance.comment] != 17.0) ||
                    (NAN((&(instance.positions)->x)[(int)instance.comment]))) {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
              ;
              greatest_info.fail_line = 0x59;
              greatest_info.msg = "instance.demands[n - 1] == 17.0";
              if ((greatest_info.flags & 4) != 0) {
                greatest_info.assertions = greatest_info.assertions + 0xf;
                abort();
              }
              filepath._4_4_ = GREATEST_TEST_RES_FAIL;
              greatest_info.assertions = greatest_info.assertions + 0xf;
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 0x10;
              if ((instance.demands[(int)instance.comment] != 6.82) ||
                 (NAN(instance.demands[(int)instance.comment]))) {
                greatest_info.fail_file =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
                ;
                greatest_info.fail_line = 0x5a;
                greatest_info.msg = "instance.profits[n - 1] == 6.82";
                if ((greatest_info.flags & 4) != 0) {
                  abort();
                }
                filepath._4_4_ = GREATEST_TEST_RES_FAIL;
              }
              else {
                instance_destroy((Instance *)&n);
                greatest_info.msg = (char *)0x0;
                filepath._4_4_ = GREATEST_TEST_RES_PASS;
              }
            }
          }
        }
      }
    }
  }
  return filepath._4_4_;
}

Assistant:

TEST parsing_single_instance(void) {
    const char *filepath = "data/ESPPRC - Test Instances/vrps/E-n101-k14_a.vrp";
    Instance instance = parse(filepath);

    CHECK_CALL(validate_instance(&instance, 100, 14));

    ASSERT(instance.positions[0].x == 35);
    ASSERT(instance.positions[0].y == 35);
    ASSERT(instance.demands[0] == 0);
    ASSERT(instance.profits[0] == 7.247);

    ASSERT(instance.positions[1].x == 41);
    ASSERT(instance.positions[1].y == 49);
    ASSERT(instance.demands[1] == 10.0);
    ASSERT(instance.profits[1] == 5.843);

    int32_t n = instance.num_customers + 1;

    ASSERT(instance.positions[n - 2].x == 20);
    ASSERT(instance.positions[n - 2].y == 26);
    ASSERT(instance.demands[n - 2] == 9.0);
    ASSERT(instance.profits[n - 2] == 3.546);

    ASSERT(instance.positions[n - 1].x == 18);
    ASSERT(instance.positions[n - 1].y == 18);
    ASSERT(instance.demands[n - 1] == 17.0);
    ASSERT(instance.profits[n - 1] == 6.82);

    instance_destroy(&instance);
    PASS();
}